

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

void __thiscall GrcManager::DebugClasses(GrcManager *this,char *pchOutputPath)

{
  GdlRenderer *this_00;
  string staOutputFilename;
  ofstream strmOut;
  allocator local_271;
  string local_270;
  long *local_250 [2];
  long local_240 [2];
  string local_230;
  undefined1 local_210 [32];
  byte abStack_1f0 [216];
  ios_base local_118 [264];
  
  std::__cxx11::string::string((string *)local_250,pchOutputPath,(allocator *)local_210);
  std::__cxx11::string::append((char *)local_250);
  std::ofstream::ofstream(local_210);
  this_00 = (GdlRenderer *)local_210;
  std::ofstream::open((char *)this_00,(_Ios_Openmode)local_250[0]);
  if ((abStack_1f0[(long)*(_func_int **)(local_210._0_8_ + -0x18)] & 5) == 0) {
    if (g_errorList.m_fFatalError == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_210,"Fatal errors--compilation aborted",0x21);
    }
    else {
      GdlRenderer::DebugClasses
                (this_00,(ostream *)local_210,&this->m_vpglfcReplcmtClasses,this->m_cpglfcLinear);
    }
    std::ofstream::close();
  }
  else {
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_270,"Error in writing to file ","");
    std::__cxx11::string::string((string *)&local_230,(char *)local_250[0],&local_271);
    GrcErrorList::AddItem
              (&g_errorList,false,0x1968,(GdlObject *)0x0,(GrpLineAndFile *)0x0,&local_270,
               &local_230,(string *)0x0,(string *)0x0,(string *)0x0,(string *)0x0,(string *)0x0,
               (string *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
  }
  local_210._0_8_ = _VTT;
  *(undefined8 *)(local_210 + (long)_VTT[-3]) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf((filebuf *)(local_210 + 8));
  std::ios_base::~ios_base(local_118);
  if (local_250[0] != local_240) {
    operator_delete(local_250[0],local_240[0] + 1);
  }
  return;
}

Assistant:

void GrcManager::DebugClasses(char * pchOutputPath)
{
	std::string staOutputFilename(pchOutputPath);
	staOutputFilename.append("/dbg_classes.txt");

	std::ofstream strmOut;
	strmOut.open(staOutputFilename.data());
	if (strmOut.fail())
	{
		g_errorList.AddWarning(6504, NULL,
			"Error in writing to file ", staOutputFilename.data());
		return;
	}

	if (g_errorList.AnyFatalErrors())
		strmOut << "Fatal errors--compilation aborted";
	else
	{
		m_prndr->DebugClasses(strmOut, m_vpglfcReplcmtClasses, m_cpglfcLinear);
	}

	strmOut.close();
}